

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_find_bracket.c
# Opt level: O1

PCRE2_SPTR8 coda__pcre2_find_bracket_8(PCRE2_SPTR8 code,BOOL utf,int number)

{
  byte bVar1;
  byte *in_RAX;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  ushort uVar5;
  bool bVar6;
  
  do {
    bVar1 = *code;
    bVar6 = true;
    if (bVar1 == 0) {
      pbVar2 = (byte *)0x0;
      bVar6 = true;
    }
    else {
      if (bVar1 == 0x77) {
        uVar5 = *(ushort *)(code + 5);
LAB_0013bf89:
        uVar4 = (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8);
      }
      else {
        if (bVar1 == 0x70) {
          uVar5 = *(ushort *)(code + 1);
          goto LAB_0013bf89;
        }
        pbVar2 = code;
        if ((byte)(bVar1 + 0x83) < 2) {
          if (number < 0) goto LAB_0013c025;
        }
        else {
          uVar4 = (ulong)(bVar1 - 0x55);
          if (bVar1 - 0x55 < 0x3b) {
            if ((0xe3fUL >> (uVar4 & 0x3f) & 1) == 0) {
              if ((0x11c0UL >> (uVar4 & 0x3f) & 1) == 0) {
                if ((0x630000000000000U >> (uVar4 & 0x3f) & 1) != 0) {
                  bVar6 = (uint)(ushort)(*(ushort *)(code + 3) << 8 | *(ushort *)(code + 3) >> 8) ==
                          number;
                  if (!bVar6) {
                    code = code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                  [bVar1];
                    pbVar2 = in_RAX;
                  }
                  goto LAB_0013c025;
                }
                goto LAB_0013bfed;
              }
              bVar3 = code[3];
            }
            else {
              bVar3 = code[1];
            }
            code = code + (ulong)((byte)(bVar3 - 0xf) < 2) * 2;
          }
          else {
LAB_0013bfed:
            if ((bVar1 - 0x9a < 9) && ((0x155U >> (bVar1 - 0x9a & 0x1f) & 1) != 0)) {
              code = code + code[1];
            }
          }
        }
        uVar4 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                       [bVar1];
      }
      code = code + uVar4;
      pbVar2 = in_RAX;
      bVar6 = false;
    }
LAB_0013c025:
    in_RAX = pbVar2;
    if (bVar6) {
      return pbVar2;
    }
  } while( true );
}

Assistant:

PCRE2_SPTR
PRIV(find_bracket)(PCRE2_SPTR code, BOOL utf, int number)
{
for (;;)
  {
  PCRE2_UCHAR c = *code;

  if (c == OP_END) return NULL;

  /* XCLASS is used for classes that cannot be represented just by a bit map.
  This includes negated single high-valued characters. CALLOUT_STR is used for
  callouts with string arguments. In both cases the length in the table is
  zero; the actual length is stored in the compiled code. */

  if (c == OP_XCLASS) code += GET(code, 1);
    else if (c == OP_CALLOUT_STR) code += GET(code, 1 + 2*LINK_SIZE);

  /* Handle lookbehind */

  else if (c == OP_REVERSE || c == OP_VREVERSE)
    {
    if (number < 0) return (PCRE2_UCHAR *)code;
    code += PRIV(OP_lengths)[c];
    }

  /* Handle capturing bracket */

  else if (c == OP_CBRA || c == OP_SCBRA ||
           c == OP_CBRAPOS || c == OP_SCBRAPOS)
    {
    int n = (int)GET2(code, 1+LINK_SIZE);
    if (n == number) return (PCRE2_UCHAR *)code;
    code += PRIV(OP_lengths)[c];
    }

  /* Otherwise, we can get the item's length from the table, except that for
  repeated character types, we have to test for \p and \P, which have an extra
  two bytes of parameters, and for MARK/PRUNE/SKIP/THEN with an argument, we
  must add in its length. */

  else
    {
    switch(c)
      {
      case OP_TYPESTAR:
      case OP_TYPEMINSTAR:
      case OP_TYPEPLUS:
      case OP_TYPEMINPLUS:
      case OP_TYPEQUERY:
      case OP_TYPEMINQUERY:
      case OP_TYPEPOSSTAR:
      case OP_TYPEPOSPLUS:
      case OP_TYPEPOSQUERY:
      if (code[1] == OP_PROP || code[1] == OP_NOTPROP) code += 2;
      break;

      case OP_TYPEUPTO:
      case OP_TYPEMINUPTO:
      case OP_TYPEEXACT:
      case OP_TYPEPOSUPTO:
      if (code[1 + IMM2_SIZE] == OP_PROP || code[1 + IMM2_SIZE] == OP_NOTPROP)
        code += 2;
      break;

      case OP_MARK:
      case OP_COMMIT_ARG:
      case OP_PRUNE_ARG:
      case OP_SKIP_ARG:
      case OP_THEN_ARG:
      code += code[1];
      break;
      }

    /* Add in the fixed length from the table */

    code += PRIV(OP_lengths)[c];

  /* In UTF-8 and UTF-16 modes, opcodes that are followed by a character may be
  followed by a multi-byte character. The length in the table is a minimum, so
  we have to arrange to skip the extra bytes. */

#ifdef MAYBE_UTF_MULTI
    if (utf) switch(c)
      {
      case OP_CHAR:
      case OP_CHARI:
      case OP_NOT:
      case OP_NOTI:
      case OP_EXACT:
      case OP_EXACTI:
      case OP_NOTEXACT:
      case OP_NOTEXACTI:
      case OP_UPTO:
      case OP_UPTOI:
      case OP_NOTUPTO:
      case OP_NOTUPTOI:
      case OP_MINUPTO:
      case OP_MINUPTOI:
      case OP_NOTMINUPTO:
      case OP_NOTMINUPTOI:
      case OP_POSUPTO:
      case OP_POSUPTOI:
      case OP_NOTPOSUPTO:
      case OP_NOTPOSUPTOI:
      case OP_STAR:
      case OP_STARI:
      case OP_NOTSTAR:
      case OP_NOTSTARI:
      case OP_MINSTAR:
      case OP_MINSTARI:
      case OP_NOTMINSTAR:
      case OP_NOTMINSTARI:
      case OP_POSSTAR:
      case OP_POSSTARI:
      case OP_NOTPOSSTAR:
      case OP_NOTPOSSTARI:
      case OP_PLUS:
      case OP_PLUSI:
      case OP_NOTPLUS:
      case OP_NOTPLUSI:
      case OP_MINPLUS:
      case OP_MINPLUSI:
      case OP_NOTMINPLUS:
      case OP_NOTMINPLUSI:
      case OP_POSPLUS:
      case OP_POSPLUSI:
      case OP_NOTPOSPLUS:
      case OP_NOTPOSPLUSI:
      case OP_QUERY:
      case OP_QUERYI:
      case OP_NOTQUERY:
      case OP_NOTQUERYI:
      case OP_MINQUERY:
      case OP_MINQUERYI:
      case OP_NOTMINQUERY:
      case OP_NOTMINQUERYI:
      case OP_POSQUERY:
      case OP_POSQUERYI:
      case OP_NOTPOSQUERY:
      case OP_NOTPOSQUERYI:
      if (HAS_EXTRALEN(code[-1])) code += GET_EXTRALEN(code[-1]);
      break;
      }
#else
    (void)(utf);  /* Keep compiler happy by referencing function argument */
#endif  /* MAYBE_UTF_MULTI */
    }
  }
}